

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addGlobal
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,size_t param_3,char *param_4
          ,vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,
          undefined8 param_7,Index param_8)

{
  Module *wasm;
  Name name;
  Err *pEVar1;
  Global **ppGVar2;
  size_type sVar3;
  bool bVar4;
  Ok local_1b9;
  value_type local_1b8;
  Err local_188;
  Err *local_168;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  Result<wasm::Global_*> _val_1;
  undefined1 local_d0 [8];
  Result<wasm::Global_*> g;
  Err local_a0;
  Err *local_70;
  Err *err;
  Result<wasm::Ok> _val;
  ImportNames *import_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *exports_local;
  ParseDeclsCtx *this_local;
  optional<wasm::Ok> param_5_local;
  Name name_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = import;
  checkImport((Result<wasm::Ok> *)&err,this,param_8,import);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._36_1_ = local_70 != (Err *)0x0;
  if ((bool)g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
  super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
  super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
  super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._36_4_ == 0) {
    name.super_IString.str._M_str = param_4;
    name.super_IString.str._M_len = param_3;
    _val_1.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._32_8_ = param_3;
    addGlobalDecl((Result<wasm::Global_*> *)local_d0,this,param_8,name,
                  (ImportNames *)
                  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
    Result<wasm::Global_*>::Result
              ((Result<wasm::Global_*> *)&err_1,(Result<wasm::Global_*> *)local_d0);
    pEVar1 = Result<wasm::Global_*>::getErr((Result<wasm::Global_*> *)&err_1);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar1);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._37_3_ = 0;
    g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._36_1_ = pEVar1 != (Err *)0x0;
    Result<wasm::Global_*>::~Result((Result<wasm::Global_*> *)&err_1);
    if (g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._36_4_ == 0) {
      wasm = this->wasm;
      ppGVar2 = Result<wasm::Global_*>::operator*((Result<wasm::Global_*> *)local_d0);
      anon_unknown_5::addExports
                ((Result<wasm::Ok> *)&err_2,&this->in,wasm,(Named *)*ppGVar2,exports,Global);
      local_168 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar4 = local_168 != (Err *)0x0;
      if (bVar4) {
        wasm::Err::Err(&local_188,local_168);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_188);
        wasm::Err::~Err(&local_188);
      }
      g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._37_3_ = 0;
      g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._36_1_ = bVar4;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._36_4_ == 0) {
        local_1b8.pos = param_8;
        local_1b8.name.super_IString.str._M_len = param_3;
        local_1b8.name.super_IString.str._M_str = param_4;
        sVar3 = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::size
                          (&this->globalDefs);
        local_1b8.index = (Index)sVar3;
        local_1b8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1b8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1b8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        vector(&local_1b8.annotations);
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::push_back
                  (&this->globalDefs,&local_1b8);
        DefPos::~DefPos(&local_1b8);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1b9);
        g.val.super__Variant_base<wasm::Global_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Global_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Global_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Global_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Global_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Global_*,_wasm::Err>._36_4_ = 1;
      }
    }
    Result<wasm::Global_*>::~Result((Result<wasm::Global_*> *)local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addGlobal(Name name,
                                  const std::vector<Name>& exports,
                                  ImportNames* import,
                                  GlobalTypeT,
                                  std::optional<ExprT>,
                                  Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto g = addGlobalDecl(pos, name, import);
  CHECK_ERR(g);
  CHECK_ERR(addExports(in, wasm, *g, exports, ExternalKind::Global));
  // TODO: global annotations
  globalDefs.push_back({name, pos, Index(globalDefs.size()), {}});
  return Ok{};
}